

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O2

BaseState<true> * __thiscall
MultiState<true>::StartObject(MultiState<true> *this,Context<true> *ctx)

{
  example *peVar1;
  
  peVar1 = (*ctx->example_factory)(ctx->example_factory_context);
  ctx->ex = peVar1;
  (*(ctx->all->p->lp).default_label)(&peVar1->l);
  v_array<example_*>::push_back(ctx->examples,&ctx->ex);
  Context<true>::PushNamespace(ctx," ",&this->super_BaseState<true>);
  return &(ctx->default_state).super_BaseState<true>;
}

Assistant:

BaseState<audit>* StartObject(Context<audit>& ctx)
  {
    // allocate new example
    ctx.ex = &(*ctx.example_factory)(ctx.example_factory_context);
    ctx.all->p->lp.default_label(&ctx.ex->l);
    ctx.examples->push_back(ctx.ex);

    // setup default namespace
    ctx.PushNamespace(" ", this);

    return &ctx.default_state;
  }